

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neurons.cpp
# Opt level: O3

int main(void)

{
  ostream *poVar1;
  pointer this;
  NeuronLayer nl;
  Neuron n1;
  Neuron n2;
  allocator_type local_b1;
  vector<Neuron,_std::allocator<Neuron>_> local_b0;
  Neuron local_98;
  Neuron local_58;
  
  local_98.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.id = Neuron::Neuron()::ID + 1;
  local_98.id = Neuron::Neuron()::ID;
  local_58.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.out.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.in.
  super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Neuron::Neuron()::ID = Neuron::Neuron()::ID + 2;
  Neuron::connect_to<Neuron>(&local_98,&local_58);
  Neuron::connect_to<Neuron>(&local_58,&local_98);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = operator<<((ostream *)&std::cout,&local_98);
  poVar1 = operator<<(poVar1,&local_58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::vector<Neuron,_std::allocator<Neuron>_>::vector(&local_b0,0xe,&local_b1);
  if (local_b0.super__Vector_base<Neuron,_std::allocator<Neuron>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_b0.super__Vector_base<Neuron,_std::allocator<Neuron>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    this = local_b0.super__Vector_base<Neuron,_std::allocator<Neuron>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      Neuron::connect_to<Neuron>(this,&local_98);
      this = this + 1;
    } while (this != local_b0.super__Vector_base<Neuron,_std::allocator<Neuron>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  }
  poVar1 = operator<<((ostream *)&std::cout,(NeuronLayer *)&local_b0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::vector<Neuron,_std::allocator<Neuron>_>::~vector(&local_b0);
  if (local_58.out.
      super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.out.
                    super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.out.
                          super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.out.
                          super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.in.
      super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.in.
                    super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.in.
                          super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.in.
                          super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.out.
      super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.out.
                    super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.out.
                          super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.out.
                          super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.in.
      super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.in.
                    super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.in.
                          super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.in.
                          super__Vector_base<std::reference_wrapper<Neuron>,_std::allocator<std::reference_wrapper<Neuron>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
	Neuron n1, n2;
	n1.connect_to(n2);
	n2.connect_to(n1);
	std::cout << n1.in.size() << " " << n1.out.size() << std::endl;
	std::cout << n2.in.size() << " " << n2.out.size() << std::endl;
	std::cout << n1 << n2 << std::endl;

	NeuronLayer nl{14};
	nl.connect_to(n1);
	std::cout << nl << std::endl;

	return 0;
}